

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::GetLibraryNames
          (cmTarget *this,string *name,string *soName,string *realName,string *impName,
          string *pdbName,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  char *pcVar4;
  bool local_231;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [8];
  string suffix;
  string base;
  string prefix;
  string local_f0;
  allocator local_c9;
  string local_c8;
  char *local_a8;
  char *soversion;
  string local_98;
  char *local_78;
  char *version;
  allocator local_59;
  undefined1 local_58 [8];
  string msg;
  string *pdbName_local;
  string *impName_local;
  string *realName_local;
  string *soName_local;
  string *name_local;
  cmTarget *this_local;
  
  msg.field_2._8_8_ = pdbName;
  bVar1 = IsImported(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_58,"GetLibraryNames called on imported target: ",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    psVar3 = GetName_abi_cxx11_(this);
    std::__cxx11::string::operator+=((string *)local_58,(string *)psVar3);
    cmMakefile::IssueMessage(this->Makefile,INTERNAL_ERROR,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    TVar2 = GetType(this);
    if (TVar2 == INTERFACE_LIBRARY) {
      __assert_fail("this->GetType() != INTERFACE_LIBRARY",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmTarget.cxx"
                    ,0xfaf,
                    "void cmTarget::GetLibraryNames(std::string &, std::string &, std::string &, std::string &, std::string &, const std::string &) const"
                   );
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"VERSION",(allocator *)((long)&soversion + 7));
    pcVar4 = GetProperty(this,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&soversion + 7));
    local_78 = pcVar4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"SOVERSION",&local_c9);
    pcVar4 = GetProperty(this,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    local_a8 = pcVar4;
    bVar1 = HasSOName(this,config);
    prefix.field_2._M_local_buf[0xe] = '\0';
    prefix.field_2._M_local_buf[0xd] = '\0';
    local_231 = true;
    if (bVar1) {
      this_00 = this->Makefile;
      std::allocator<char>::allocator();
      prefix.field_2._M_local_buf[0xe] = '\x01';
      std::__cxx11::string::string
                ((string *)&local_f0,"CMAKE_PLATFORM_NO_VERSIONED_SONAME",
                 (allocator *)(prefix.field_2._M_local_buf + 0xf));
      prefix.field_2._M_local_buf[0xd] = '\x01';
      bVar1 = cmMakefile::IsOn(this_00,&local_f0);
      local_231 = true;
      if (!bVar1) {
        local_231 = IsFrameworkOnApple(this);
      }
    }
    if ((prefix.field_2._M_local_buf[0xd] & 1U) != 0) {
      std::__cxx11::string::~string((string *)&local_f0);
    }
    if ((prefix.field_2._M_local_buf[0xe] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
    }
    if (local_231 != false) {
      local_78 = (char *)0x0;
      local_a8 = (char *)0x0;
    }
    if ((local_78 != (char *)0x0) && (local_a8 == (char *)0x0)) {
      local_a8 = local_78;
    }
    if ((local_78 == (char *)0x0) && (local_a8 != (char *)0x0)) {
      local_78 = local_a8;
    }
    std::__cxx11::string::string((string *)(base.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_158);
    GetFullNameInternal(this,config,false,(string *)(base.field_2._M_local_buf + 8),
                        (string *)(suffix.field_2._M_local_buf + 8),(string *)local_158);
    std::operator+(&local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&base.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&suffix.field_2 + 8));
    std::operator+(&local_178,&local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    std::__cxx11::string::operator=((string *)name,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    bVar1 = IsFrameworkOnApple(this);
    if (bVar1) {
      std::__cxx11::string::operator=((string *)realName,(string *)(base.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)realName,"Versions/");
      GetFrameworkVersion_abi_cxx11_(&local_1b8,this);
      std::__cxx11::string::operator+=((string *)realName,(string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::operator+=((string *)realName,"/");
      std::__cxx11::string::operator+=
                ((string *)realName,(string *)(suffix.field_2._M_local_buf + 8));
      std::__cxx11::string::operator=((string *)soName,(string *)realName);
    }
    else {
      ComputeVersionedName
                (this,soName,(string *)((long)&base.field_2 + 8),
                 (string *)((long)&suffix.field_2 + 8),(string *)local_158,name,local_a8);
      ComputeVersionedName
                (this,realName,(string *)((long)&base.field_2 + 8),
                 (string *)((long)&suffix.field_2 + 8),(string *)local_158,name,local_78);
    }
    TVar2 = GetType(this);
    if ((TVar2 == SHARED_LIBRARY) || (TVar2 = GetType(this), TVar2 == MODULE_LIBRARY)) {
      GetFullNameInternal(&local_1d8,this,config,true);
      std::__cxx11::string::operator=((string *)impName,(string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    else {
      std::__cxx11::string::operator=((string *)impName,"");
    }
    GetPDBName(&local_1f8,this,config);
    std::__cxx11::string::operator=((string *)msg.field_2._8_8_,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void cmTarget::GetLibraryNames(std::string& name,
                               std::string& soName,
                               std::string& realName,
                               std::string& impName,
                               std::string& pdbName,
                               const std::string& config) const
{
  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if(this->IsImported())
    {
    std::string msg =  "GetLibraryNames called on imported target: ";
    msg += this->GetName();
    this->Makefile->IssueMessage(cmake::INTERNAL_ERROR,
                                 msg);
    return;
    }

  assert(this->GetType() != INTERFACE_LIBRARY);

  // Check for library version properties.
  const char* version = this->GetProperty("VERSION");
  const char* soversion = this->GetProperty("SOVERSION");
  if(!this->HasSOName(config) ||
     this->Makefile->IsOn("CMAKE_PLATFORM_NO_VERSIONED_SONAME") ||
     this->IsFrameworkOnApple())
    {
    // Versioning is supported only for shared libraries and modules,
    // and then only when the platform supports an soname flag.
    version = 0;
    soversion = 0;
    }
  if(version && !soversion)
    {
    // The soversion must be set if the library version is set.  Use
    // the library version as the soversion.
    soversion = version;
    }
  if(!version && soversion)
    {
    // Use the soversion as the library version.
    version = soversion;
    }

  // Get the components of the library name.
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, false, prefix, base, suffix);

  // The library name.
  name = prefix+base+suffix;

  if(this->IsFrameworkOnApple())
    {
    realName = prefix;
    realName += "Versions/";
    realName += this->GetFrameworkVersion();
    realName += "/";
    realName += base;
    soName = realName;
    }
  else
    {
    // The library's soname.
    this->ComputeVersionedName(soName, prefix, base, suffix,
                               name, soversion);
    // The library's real name on disk.
    this->ComputeVersionedName(realName, prefix, base, suffix,
                               name, version);
    }

  // The import library name.
  if(this->GetType() == cmTarget::SHARED_LIBRARY ||
     this->GetType() == cmTarget::MODULE_LIBRARY)
    {
    impName = this->GetFullNameInternal(config, true);
    }
  else
    {
    impName = "";
    }

  // The program database file name.
  pdbName = this->GetPDBName(config);
}